

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Model::MergeFrom(Model *this,Model *from)

{
  bool bVar1;
  int32 iVar2;
  TypeCase TVar3;
  LogMessage *other;
  ModelDescription *this_00;
  ModelDescription *from_00;
  PipelineClassifier *this_01;
  PipelineClassifier *from_01;
  PipelineRegressor *this_02;
  PipelineRegressor *from_02;
  Pipeline *this_03;
  Pipeline *from_03;
  GLMRegressor *this_04;
  GLMRegressor *from_04;
  SupportVectorRegressor *this_05;
  SupportVectorRegressor *from_05;
  TreeEnsembleRegressor *this_06;
  TreeEnsembleRegressor *from_06;
  NeuralNetworkRegressor *this_07;
  NeuralNetworkRegressor *from_07;
  BayesianProbitRegressor *this_08;
  BayesianProbitRegressor *from_08;
  GLMClassifier *this_09;
  GLMClassifier *from_09;
  SupportVectorClassifier *this_10;
  SupportVectorClassifier *from_10;
  TreeEnsembleClassifier *this_11;
  TreeEnsembleClassifier *from_11;
  NeuralNetworkClassifier *this_12;
  NeuralNetworkClassifier *from_12;
  KNearestNeighborsClassifier *this_13;
  KNearestNeighborsClassifier *from_13;
  NeuralNetwork *this_14;
  NeuralNetwork *from_14;
  ItemSimilarityRecommender *this_15;
  ItemSimilarityRecommender *from_15;
  CustomModel *this_16;
  CustomModel *from_16;
  LinkedModel *this_17;
  LinkedModel *from_17;
  OneHotEncoder *this_18;
  OneHotEncoder *from_18;
  Imputer *this_19;
  Imputer *from_19;
  FeatureVectorizer *this_20;
  FeatureVectorizer *from_20;
  DictVectorizer *this_21;
  DictVectorizer *from_21;
  Scaler *this_22;
  Scaler *from_22;
  CategoricalMapping *this_23;
  CategoricalMapping *from_23;
  Normalizer *this_24;
  Normalizer *from_24;
  ArrayFeatureExtractor *this_25;
  ArrayFeatureExtractor *from_25;
  NonMaximumSuppression *this_26;
  NonMaximumSuppression *from_26;
  Identity *this_27;
  Identity *from_27;
  TextClassifier *this_28;
  TextClassifier *from_28;
  WordTagger *this_29;
  WordTagger *from_29;
  VisionFeaturePrint *this_30;
  VisionFeaturePrint *from_30;
  SoundAnalysisPreprocessing *this_31;
  SoundAnalysisPreprocessing *from_31;
  Gazetteer *this_32;
  Gazetteer *from_32;
  WordEmbedding *this_33;
  WordEmbedding *from_33;
  SerializedModel *this_34;
  SerializedModel *from_34;
  InternalMetadataWithArenaLite *this_35;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  Model *local_58;
  Model *from_local;
  Model *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  Container *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O0/mlmodel/format/Model.pb.cc"
               ,0x115b);
    local_91 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,other);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_35 = &this->_internal_metadata_;
  this_local = (Model *)&local_58->_internal_metadata_;
  local_40 = this_35;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_35,&local_20->unknown_fields);
  }
  bVar1 = has_description(local_58);
  if (bVar1) {
    this_00 = mutable_description(this);
    from_00 = description(local_58);
    ModelDescription::MergeFrom(this_00,from_00);
  }
  iVar2 = specificationversion(local_58);
  if (iVar2 != 0) {
    iVar2 = specificationversion(local_58);
    set_specificationversion(this,iVar2);
  }
  bVar1 = isupdatable(local_58);
  if (bVar1) {
    bVar1 = isupdatable(local_58);
    set_isupdatable(this,bVar1);
  }
  TVar3 = Type_case(local_58);
  if (TVar3 != TYPE_NOT_SET) {
    if (TVar3 == kPipelineClassifier) {
      this_01 = mutable_pipelineclassifier(this);
      from_01 = pipelineclassifier(local_58);
      PipelineClassifier::MergeFrom(this_01,from_01);
    }
    else if (TVar3 == kPipelineRegressor) {
      this_02 = mutable_pipelineregressor(this);
      from_02 = pipelineregressor(local_58);
      PipelineRegressor::MergeFrom(this_02,from_02);
    }
    else if (TVar3 == kPipeline) {
      this_03 = mutable_pipeline(this);
      from_03 = pipeline(local_58);
      Pipeline::MergeFrom(this_03,from_03);
    }
    else if (TVar3 == kGlmRegressor) {
      this_04 = mutable_glmregressor(this);
      from_04 = glmregressor(local_58);
      GLMRegressor::MergeFrom(this_04,from_04);
    }
    else if (TVar3 == kSupportVectorRegressor) {
      this_05 = mutable_supportvectorregressor(this);
      from_05 = supportvectorregressor(local_58);
      SupportVectorRegressor::MergeFrom(this_05,from_05);
    }
    else if (TVar3 == kTreeEnsembleRegressor) {
      this_06 = mutable_treeensembleregressor(this);
      from_06 = treeensembleregressor(local_58);
      TreeEnsembleRegressor::MergeFrom(this_06,from_06);
    }
    else if (TVar3 == kNeuralNetworkRegressor) {
      this_07 = mutable_neuralnetworkregressor(this);
      from_07 = neuralnetworkregressor(local_58);
      NeuralNetworkRegressor::MergeFrom(this_07,from_07);
    }
    else if (TVar3 == kBayesianProbitRegressor) {
      this_08 = mutable_bayesianprobitregressor(this);
      from_08 = bayesianprobitregressor(local_58);
      BayesianProbitRegressor::MergeFrom(this_08,from_08);
    }
    else if (TVar3 == kGlmClassifier) {
      this_09 = mutable_glmclassifier(this);
      from_09 = glmclassifier(local_58);
      GLMClassifier::MergeFrom(this_09,from_09);
    }
    else if (TVar3 == kSupportVectorClassifier) {
      this_10 = mutable_supportvectorclassifier(this);
      from_10 = supportvectorclassifier(local_58);
      SupportVectorClassifier::MergeFrom(this_10,from_10);
    }
    else if (TVar3 == kTreeEnsembleClassifier) {
      this_11 = mutable_treeensembleclassifier(this);
      from_11 = treeensembleclassifier(local_58);
      TreeEnsembleClassifier::MergeFrom(this_11,from_11);
    }
    else if (TVar3 == kNeuralNetworkClassifier) {
      this_12 = mutable_neuralnetworkclassifier(this);
      from_12 = neuralnetworkclassifier(local_58);
      NeuralNetworkClassifier::MergeFrom(this_12,from_12);
    }
    else if (TVar3 == kKNearestNeighborsClassifier) {
      this_13 = mutable_knearestneighborsclassifier(this);
      from_13 = knearestneighborsclassifier(local_58);
      KNearestNeighborsClassifier::MergeFrom(this_13,from_13);
    }
    else if (TVar3 == kNeuralNetwork) {
      this_14 = mutable_neuralnetwork(this);
      from_14 = neuralnetwork(local_58);
      NeuralNetwork::MergeFrom(this_14,from_14);
    }
    else if (TVar3 == kItemSimilarityRecommender) {
      this_15 = mutable_itemsimilarityrecommender(this);
      from_15 = itemsimilarityrecommender(local_58);
      ItemSimilarityRecommender::MergeFrom(this_15,from_15);
    }
    else if (TVar3 == kCustomModel) {
      this_16 = mutable_custommodel(this);
      from_16 = custommodel(local_58);
      CustomModel::MergeFrom(this_16,from_16);
    }
    else if (TVar3 == kLinkedModel) {
      this_17 = mutable_linkedmodel(this);
      from_17 = linkedmodel(local_58);
      LinkedModel::MergeFrom(this_17,from_17);
    }
    else if (TVar3 == kOneHotEncoder) {
      this_18 = mutable_onehotencoder(this);
      from_18 = onehotencoder(local_58);
      OneHotEncoder::MergeFrom(this_18,from_18);
    }
    else if (TVar3 == kImputer) {
      this_19 = mutable_imputer(this);
      from_19 = imputer(local_58);
      Imputer::MergeFrom(this_19,from_19);
    }
    else if (TVar3 == kFeatureVectorizer) {
      this_20 = mutable_featurevectorizer(this);
      from_20 = featurevectorizer(local_58);
      FeatureVectorizer::MergeFrom(this_20,from_20);
    }
    else if (TVar3 == kDictVectorizer) {
      this_21 = mutable_dictvectorizer(this);
      from_21 = dictvectorizer(local_58);
      DictVectorizer::MergeFrom(this_21,from_21);
    }
    else if (TVar3 == kScaler) {
      this_22 = mutable_scaler(this);
      from_22 = scaler(local_58);
      Scaler::MergeFrom(this_22,from_22);
    }
    else if (TVar3 == kCategoricalMapping) {
      this_23 = mutable_categoricalmapping(this);
      from_23 = categoricalmapping(local_58);
      CategoricalMapping::MergeFrom(this_23,from_23);
    }
    else if (TVar3 == kNormalizer) {
      this_24 = mutable_normalizer(this);
      from_24 = normalizer(local_58);
      Normalizer::MergeFrom(this_24,from_24);
    }
    else if (TVar3 == kArrayFeatureExtractor) {
      this_25 = mutable_arrayfeatureextractor(this);
      from_25 = arrayfeatureextractor(local_58);
      ArrayFeatureExtractor::MergeFrom(this_25,from_25);
    }
    else if (TVar3 == kNonMaximumSuppression) {
      this_26 = mutable_nonmaximumsuppression(this);
      from_26 = nonmaximumsuppression(local_58);
      NonMaximumSuppression::MergeFrom(this_26,from_26);
    }
    else if (TVar3 == kIdentity) {
      this_27 = mutable_identity(this);
      from_27 = identity(local_58);
      Identity::MergeFrom(this_27,from_27);
    }
    else if (TVar3 == kTextClassifier) {
      this_28 = mutable_textclassifier(this);
      from_28 = textclassifier(local_58);
      CoreMLModels::TextClassifier::MergeFrom(this_28,from_28);
    }
    else if (TVar3 == kWordTagger) {
      this_29 = mutable_wordtagger(this);
      from_29 = wordtagger(local_58);
      CoreMLModels::WordTagger::MergeFrom(this_29,from_29);
    }
    else if (TVar3 == kVisionFeaturePrint) {
      this_30 = mutable_visionfeatureprint(this);
      from_30 = visionfeatureprint(local_58);
      CoreMLModels::VisionFeaturePrint::MergeFrom(this_30,from_30);
    }
    else if (TVar3 == kSoundAnalysisPreprocessing) {
      this_31 = mutable_soundanalysispreprocessing(this);
      from_31 = soundanalysispreprocessing(local_58);
      CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(this_31,from_31);
    }
    else if (TVar3 == kGazetteer) {
      this_32 = mutable_gazetteer(this);
      from_32 = gazetteer(local_58);
      CoreMLModels::Gazetteer::MergeFrom(this_32,from_32);
    }
    else if (TVar3 == kWordEmbedding) {
      this_33 = mutable_wordembedding(this);
      from_33 = wordembedding(local_58);
      CoreMLModels::WordEmbedding::MergeFrom(this_33,from_33);
    }
    else if (TVar3 == kSerializedModel) {
      this_34 = mutable_serializedmodel(this);
      from_34 = serializedmodel(local_58);
      SerializedModel::MergeFrom(this_34,from_34);
    }
  }
  return;
}

Assistant:

void Model::MergeFrom(const Model& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Model)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_description()) {
    mutable_description()->::CoreML::Specification::ModelDescription::MergeFrom(from.description());
  }
  if (from.specificationversion() != 0) {
    set_specificationversion(from.specificationversion());
  }
  if (from.isupdatable() != 0) {
    set_isupdatable(from.isupdatable());
  }
  switch (from.Type_case()) {
    case kPipelineClassifier: {
      mutable_pipelineclassifier()->::CoreML::Specification::PipelineClassifier::MergeFrom(from.pipelineclassifier());
      break;
    }
    case kPipelineRegressor: {
      mutable_pipelineregressor()->::CoreML::Specification::PipelineRegressor::MergeFrom(from.pipelineregressor());
      break;
    }
    case kPipeline: {
      mutable_pipeline()->::CoreML::Specification::Pipeline::MergeFrom(from.pipeline());
      break;
    }
    case kGlmRegressor: {
      mutable_glmregressor()->::CoreML::Specification::GLMRegressor::MergeFrom(from.glmregressor());
      break;
    }
    case kSupportVectorRegressor: {
      mutable_supportvectorregressor()->::CoreML::Specification::SupportVectorRegressor::MergeFrom(from.supportvectorregressor());
      break;
    }
    case kTreeEnsembleRegressor: {
      mutable_treeensembleregressor()->::CoreML::Specification::TreeEnsembleRegressor::MergeFrom(from.treeensembleregressor());
      break;
    }
    case kNeuralNetworkRegressor: {
      mutable_neuralnetworkregressor()->::CoreML::Specification::NeuralNetworkRegressor::MergeFrom(from.neuralnetworkregressor());
      break;
    }
    case kBayesianProbitRegressor: {
      mutable_bayesianprobitregressor()->::CoreML::Specification::BayesianProbitRegressor::MergeFrom(from.bayesianprobitregressor());
      break;
    }
    case kGlmClassifier: {
      mutable_glmclassifier()->::CoreML::Specification::GLMClassifier::MergeFrom(from.glmclassifier());
      break;
    }
    case kSupportVectorClassifier: {
      mutable_supportvectorclassifier()->::CoreML::Specification::SupportVectorClassifier::MergeFrom(from.supportvectorclassifier());
      break;
    }
    case kTreeEnsembleClassifier: {
      mutable_treeensembleclassifier()->::CoreML::Specification::TreeEnsembleClassifier::MergeFrom(from.treeensembleclassifier());
      break;
    }
    case kNeuralNetworkClassifier: {
      mutable_neuralnetworkclassifier()->::CoreML::Specification::NeuralNetworkClassifier::MergeFrom(from.neuralnetworkclassifier());
      break;
    }
    case kKNearestNeighborsClassifier: {
      mutable_knearestneighborsclassifier()->::CoreML::Specification::KNearestNeighborsClassifier::MergeFrom(from.knearestneighborsclassifier());
      break;
    }
    case kNeuralNetwork: {
      mutable_neuralnetwork()->::CoreML::Specification::NeuralNetwork::MergeFrom(from.neuralnetwork());
      break;
    }
    case kItemSimilarityRecommender: {
      mutable_itemsimilarityrecommender()->::CoreML::Specification::ItemSimilarityRecommender::MergeFrom(from.itemsimilarityrecommender());
      break;
    }
    case kCustomModel: {
      mutable_custommodel()->::CoreML::Specification::CustomModel::MergeFrom(from.custommodel());
      break;
    }
    case kLinkedModel: {
      mutable_linkedmodel()->::CoreML::Specification::LinkedModel::MergeFrom(from.linkedmodel());
      break;
    }
    case kOneHotEncoder: {
      mutable_onehotencoder()->::CoreML::Specification::OneHotEncoder::MergeFrom(from.onehotencoder());
      break;
    }
    case kImputer: {
      mutable_imputer()->::CoreML::Specification::Imputer::MergeFrom(from.imputer());
      break;
    }
    case kFeatureVectorizer: {
      mutable_featurevectorizer()->::CoreML::Specification::FeatureVectorizer::MergeFrom(from.featurevectorizer());
      break;
    }
    case kDictVectorizer: {
      mutable_dictvectorizer()->::CoreML::Specification::DictVectorizer::MergeFrom(from.dictvectorizer());
      break;
    }
    case kScaler: {
      mutable_scaler()->::CoreML::Specification::Scaler::MergeFrom(from.scaler());
      break;
    }
    case kCategoricalMapping: {
      mutable_categoricalmapping()->::CoreML::Specification::CategoricalMapping::MergeFrom(from.categoricalmapping());
      break;
    }
    case kNormalizer: {
      mutable_normalizer()->::CoreML::Specification::Normalizer::MergeFrom(from.normalizer());
      break;
    }
    case kArrayFeatureExtractor: {
      mutable_arrayfeatureextractor()->::CoreML::Specification::ArrayFeatureExtractor::MergeFrom(from.arrayfeatureextractor());
      break;
    }
    case kNonMaximumSuppression: {
      mutable_nonmaximumsuppression()->::CoreML::Specification::NonMaximumSuppression::MergeFrom(from.nonmaximumsuppression());
      break;
    }
    case kIdentity: {
      mutable_identity()->::CoreML::Specification::Identity::MergeFrom(from.identity());
      break;
    }
    case kTextClassifier: {
      mutable_textclassifier()->::CoreML::Specification::CoreMLModels::TextClassifier::MergeFrom(from.textclassifier());
      break;
    }
    case kWordTagger: {
      mutable_wordtagger()->::CoreML::Specification::CoreMLModels::WordTagger::MergeFrom(from.wordtagger());
      break;
    }
    case kVisionFeaturePrint: {
      mutable_visionfeatureprint()->::CoreML::Specification::CoreMLModels::VisionFeaturePrint::MergeFrom(from.visionfeatureprint());
      break;
    }
    case kSoundAnalysisPreprocessing: {
      mutable_soundanalysispreprocessing()->::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(from.soundanalysispreprocessing());
      break;
    }
    case kGazetteer: {
      mutable_gazetteer()->::CoreML::Specification::CoreMLModels::Gazetteer::MergeFrom(from.gazetteer());
      break;
    }
    case kWordEmbedding: {
      mutable_wordembedding()->::CoreML::Specification::CoreMLModels::WordEmbedding::MergeFrom(from.wordembedding());
      break;
    }
    case kSerializedModel: {
      mutable_serializedmodel()->::CoreML::Specification::SerializedModel::MergeFrom(from.serializedmodel());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
}